

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters.c
# Opt level: O3

void ihevc_intra_pred_luma_dc
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  UWORD8 *pUVar6;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  
  uVar1 = nt << 0x1e | nt - 4U >> 2;
  bVar3 = 6;
  if (uVar1 < 4) {
    bVar3 = (byte)*(undefined4 *)(&DAT_00174170 + (ulong)uVar1 * 4);
  }
  uVar5 = (ulong)nt;
  uVar8 = uVar5 * 2;
  iVar2 = 0;
  iVar4 = (int)uVar8;
  if (nt < iVar4) {
    iVar2 = 0;
    do {
      iVar2 = iVar2 + (uint)pu1_ref[uVar5];
      uVar5 = uVar5 + 1;
    } while ((long)iVar4 != uVar5);
  }
  if (SBORROW4(iVar4,nt * 3) != iVar4 + nt * -3 < 0) {
    lVar7 = 0;
    do {
      iVar2 = iVar2 + (uint)pu1_ref[lVar7 + uVar8 + 1];
      lVar7 = lVar7 + 1;
    } while (nt != (int)lVar7);
  }
  uVar1 = iVar2 + nt >> (bVar3 & 0x1f);
  if (nt == 0x20) {
    lVar7 = 0x20;
    auVar9 = pshufb(ZEXT416(uVar1 & 0xff),(undefined1  [16])0x0);
    do {
      *(undefined1 (*) [16])((long)pu1_dst + 0x10) = auVar9;
      *(undefined1 (*) [16])pu1_dst = auVar9;
      pu1_dst = *(undefined1 (*) [16])pu1_dst + dst_strd;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  else {
    *pu1_dst = (UWORD8)((uint)pu1_ref[uVar8 - 1] + uVar1 * 2 + (uint)pu1_ref[(long)iVar4 | 1] + 2 >>
                       2);
    if (1 < nt) {
      iVar2 = uVar1 * 3 + 2;
      lVar7 = 0;
      do {
        pu1_dst[lVar7 + 1] = (UWORD8)((uint)pu1_ref[lVar7 + (uVar8 & 0xffffffff) + 2] + iVar2 >> 2);
        lVar7 = lVar7 + 1;
      } while ((ulong)(uint)nt - 1 != lVar7);
      if (1 < nt) {
        pUVar6 = pu1_dst + dst_strd;
        lVar7 = 0;
        do {
          *pUVar6 = (UWORD8)((uint)pu1_ref[lVar7 + (iVar4 + -2)] + iVar2 >> 2);
          pUVar6 = pUVar6 + dst_strd;
          lVar7 = lVar7 + -1;
        } while (1 - (ulong)(uint)nt != lVar7);
        if (1 < nt) {
          iVar2 = dst_strd + 1;
          uVar8 = (ulong)(nt - 1);
          do {
            memset(pu1_dst + iVar2,uVar1 & 0xff,(ulong)(nt - 1));
            iVar2 = iVar2 + dst_strd;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
      }
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_dc(UWORD8 *pu1_ref,
                              WORD32 src_strd,
                              UWORD8 *pu1_dst,
                              WORD32 dst_strd,
                              WORD32 nt,
                              WORD32 mode)
{

    WORD32 acc_dc;
    WORD32 dc_val, two_dc_val, three_dc_val;
    WORD32 i;
    WORD32 row, col;
    WORD32 log2nt = 5;
    WORD32 two_nt, three_nt;
    UNUSED(mode);
    UNUSED(src_strd);
    switch(nt)
    {
        case 32:
            log2nt = 5;
            break;
        case 16:
            log2nt = 4;
            break;
        case 8:
            log2nt = 3;
            break;
        case 4:
            log2nt = 2;
            break;
        default:
            break;
    }
    two_nt = 2 * nt;
    three_nt = 3 * nt;

    acc_dc = 0;
    /* Calculate DC value for the transform block */
    for(i = nt; i < two_nt; i++)
        acc_dc += pu1_ref[i];

    for(i = (two_nt + 1); i <= three_nt; i++)
        acc_dc += pu1_ref[i];

    dc_val = (acc_dc + nt) >> (log2nt + 1);

    two_dc_val = 2 * dc_val;
    three_dc_val = 3 * dc_val;


    if(nt == 32)
    {
        for(row = 0; row < nt; row++)
            for(col = 0; col < nt; col++)
                pu1_dst[(row * dst_strd) + col] = dc_val;
    }
    else
    {
        /* DC filtering for the first top row and first left column */
        pu1_dst[0] = ((pu1_ref[two_nt - 1] + two_dc_val + pu1_ref[two_nt + 1] + 2)
                        >> 2);

        for(col = 1; col < nt; col++)
            pu1_dst[col] = (pu1_ref[two_nt + 1 + col] + three_dc_val + 2) >> 2;

        for(row = 1; row < nt; row++)
            pu1_dst[row * dst_strd] = (pu1_ref[two_nt - 1 - row] + three_dc_val + 2)
                            >> 2;

        /* Fill the remaining rows with DC value*/
        for(row = 1; row < nt; row++)
            for(col = 1; col < nt; col++)
                pu1_dst[(row * dst_strd) + col] = dc_val;
    }
}